

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsImport.cpp
# Opt level: O3

int rotate_point(double cx,double cy,double angle,POINT *subject)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double __x;
  double dVar4;
  double dVar5;
  double dStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  
  dVar5 = subject->x;
  dVar4 = subject->y;
  dVar2 = (angle * 3.141592653589) / 180.0;
  dVar3 = sin(dVar2);
  dVar2 = cos(dVar2);
  dVar5 = dVar5 - cx;
  dVar4 = dVar4 - cy;
  __x = dVar2 * dVar5 + -dVar4 * dVar3 + cx;
  dVar5 = dVar3 * dVar5 + dVar2 * dVar4 + cy;
  auVar1._8_4_ = SUB84(dVar5,0);
  auVar1._0_8_ = __x;
  auVar1._12_4_ = (int)((ulong)dVar5 >> 0x20);
  dVar5 = round(__x);
  dStack_60 = auVar1._8_8_;
  dVar4 = round(dStack_60);
  local_58 = SUB84(dVar5,0);
  uStack_54 = (undefined4)((ulong)dVar5 >> 0x20);
  *(undefined4 *)&subject->x = local_58;
  *(undefined4 *)((long)&subject->x + 4) = uStack_54;
  *(int *)&subject->y = SUB84(dVar4,0);
  *(int *)((long)&subject->y + 4) = (int)((ulong)dVar4 >> 0x20);
  return 0;
}

Assistant:

int rotate_point(double cx, double cy, double angle, POINT &subject)
{
  POINT p = subject;
  angle = angle * 3.141592653589 / 180; // convert angle to radians
  double s = sin(angle);
  double c = cos(angle);

  // translate point back to origin:
  p.x -= cx;
  p.y -= cy;

  // rotate point
  double xnew = p.x * c - p.y * s;
  double ynew = p.x * s + p.y * c;

  // translate point back:
  p.x = round(xnew + cx);
  p.y = round(ynew + cy);
  subject = p;         // Overwrite the original point with the rotated one.
  return EXIT_SUCCESS; // Indicate successful conversion.
}